

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.hh
# Opt level: O2

VarnodeData * __thiscall AddrSpace::getSpacebaseFull(AddrSpace *this,int4 i)

{
  LowlevelError *this_00;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20,CONCAT44(in_register_00000034,i));
  std::operator+(&bStack_38,&this->name," has no truncated registers");
  LowlevelError::LowlevelError(this_00,&bStack_38);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

inline const VarnodeData &AddrSpace::getSpacebaseFull(int4 i) const {
  throw LowlevelError(name+" has no truncated registers");
}